

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

const_iterator __thiscall
QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
::find(QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
       *this,DBusKey *key)

{
  bool bVar1;
  const_iterator cVar2;
  
  cVar2 = lower_bound(this,key);
  if ((cVar2.c != &this->c) || (cVar2.i != (this->c).keys.d.size)) {
    bVar1 = QDBusListener::DBusKey::operator<
                      (key,(((containers *)&(cVar2.c)->keys)->keys).d.ptr + cVar2.i);
    if (bVar1) {
      cVar2.i = (this->c).keys.d.size;
      cVar2.c = &this->c;
    }
  }
  return cVar2;
}

Assistant:

const_iterator find(const Key &key) const
    {
        auto it = lower_bound(key);
        if (it != end()) {
            if (!key_compare::operator()(key, it.key()))
                return it;
            it = end();
        }
        return it;
    }